

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_socket.c
# Opt level: O1

log_policy_interface log_policy_stream_socket_interface(void)

{
  return &log_policy_stream_socket_interface::policy_interface_stream;
}

Assistant:

log_policy_interface log_policy_stream_socket_interface(void)
{
	static struct log_policy_stream_impl_type log_policy_stream_socket_impl_obj = {
		&log_policy_stream_socket_write,
		&log_policy_stream_socket_flush
	};

	static struct log_policy_interface_type policy_interface_stream = {
		&log_policy_stream_socket_create,
		&log_policy_stream_socket_impl_obj,
		&log_policy_stream_socket_destroy
	};

	return &policy_interface_stream;
}